

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_insertAndFindFirstIndex_internal
              (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,U32 mls)

{
  U32 *pUVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  char cVar4;
  undefined4 in_register_0000000c;
  long *plVar5;
  undefined4 in_R8D;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  
  plVar5 = (long *)CONCAT44(in_register_0000000c,mls);
  lVar8 = -0x30e44323485a9b9d;
  pUVar1 = ms->hashTable;
  pBVar2 = (ms->window).base;
  uVar7 = (ulong)ms->nextToUpdate;
  uVar9 = (uint)((long)plVar5 - (long)pBVar2);
  cVar4 = (char)ip;
  if (ms->nextToUpdate < uVar9) {
    pUVar3 = ms->chainTable;
    do {
      switch(in_R8D) {
      case 5:
        uVar6 = *(long *)(pBVar2 + uVar7) * -0x30e4432345000000;
        break;
      case 6:
        uVar6 = *(long *)(pBVar2 + uVar7) * -0x30e4432340650000;
        break;
      case 7:
        uVar6 = *(long *)(pBVar2 + uVar7) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar6 = *(long *)(pBVar2 + uVar7) * -0x30e44323485a9b9d;
        break;
      default:
        uVar6 = (ulong)((uint)(*(int *)(pBVar2 + uVar7) * -0x61c8864f) >> (0x20U - cVar4 & 0x1f));
        goto LAB_001555af;
      }
      uVar6 = uVar6 >> (0x40U - cVar4 & 0x3f);
LAB_001555af:
      pUVar3[(uint)uVar7 & ~(-1 << ((byte)cParams & 0x1f))] = pUVar1[uVar6];
      pUVar1[uVar6] = (uint)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar7 < ((long)plVar5 - (long)pBVar2 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar9;
  switch(in_R8D) {
  case 5:
    lVar8 = -0x30e4432345000000;
    break;
  case 6:
    lVar8 = -0x30e4432340650000;
    break;
  case 7:
    lVar8 = -0x30e44323405a9d00;
    break;
  case 8:
    break;
  default:
    uVar7 = (ulong)((uint)((int)*plVar5 * -0x61c8864f) >> (-cVar4 & 0x1fU));
    goto LAB_0015562c;
  }
  uVar7 = (ulong)(lVar8 * *plVar5) >> (-cVar4 & 0x3fU);
LAB_0015562c:
  return pUVar1[uVar7];
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndex_internal(
                        ZSTD_matchState_t* ms,
                        const ZSTD_compressionParameters* const cParams,
                        const BYTE* ip, U32 const mls)
{
    U32* const hashTable  = ms->hashTable;
    const U32 hashLog = cParams->hashLog;
    U32* const chainTable = ms->chainTable;
    const U32 chainMask = (1 << cParams->chainLog) - 1;
    const BYTE* const base = ms->window.base;
    const U32 target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    while(idx < target) { /* catch up */
        size_t const h = ZSTD_hashPtr(base+idx, hashLog, mls);
        NEXT_IN_CHAIN(idx, chainMask) = hashTable[h];
        hashTable[h] = idx;
        idx++;
    }

    ms->nextToUpdate = target;
    return hashTable[ZSTD_hashPtr(ip, hashLog, mls)];
}